

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O1

Type * __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
ReleaseLastInternal<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
          (RepeatedPtrFieldBase *this)

{
  int iVar1;
  int iVar2;
  Rep *pRVar3;
  LogMessage *other;
  Type *pTVar4;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (this->current_size_ < 1) {
    LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
               ,0x4a2);
    other = LogMessage::operator<<(&local_50,"CHECK failed: (current_size_) > (0): ");
    LogFinisher::operator=(&local_51,other);
    LogMessage::~LogMessage(&local_50);
  }
  pRVar3 = this->rep_;
  iVar1 = this->current_size_;
  this->current_size_ = iVar1 + -1;
  pTVar4 = (Type *)pRVar3->elements[(long)iVar1 + -1];
  iVar2 = pRVar3->allocated_size;
  pRVar3->allocated_size = iVar2 + -1;
  if (iVar1 < iVar2) {
    pRVar3->elements[(long)iVar1 + -1] = pRVar3->elements[(long)iVar2 + -1];
  }
  if (this->arena_ != (Arena *)0x0) {
    pTVar4 = (Type *)operator_new(0x20);
    (pTVar4->_M_dataplus)._M_p = (pointer)&pTVar4->field_2;
    pTVar4->_M_string_length = 0;
    (pTVar4->field_2)._M_local_buf[0] = '\0';
    std::__cxx11::string::_M_assign((string *)pTVar4);
  }
  return pTVar4;
}

Assistant:

inline typename TypeHandler::Type* RepeatedPtrFieldBase::ReleaseLastInternal(
    std::true_type) {
  // First, release an element.
  typename TypeHandler::Type* result = UnsafeArenaReleaseLast<TypeHandler>();
  // Now perform a copy if we're on an arena.
  Arena* arena = GetArena();

  typename TypeHandler::Type* new_result;
#ifdef PROTOBUF_FORCE_COPY_IN_RELEASE
  new_result = copy<TypeHandler>(result);
  if (arena == nullptr) delete result;
#else   // PROTOBUF_FORCE_COPY_IN_RELEASE
  new_result = (arena == nullptr) ? result : copy<TypeHandler>(result);
#endif  // !PROTOBUF_FORCE_COPY_IN_RELEASE
  return new_result;
}